

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O2

void __thiscall webrtc::AudioProcessingImpl::UpdateHistogramsOnCallEnd(AudioProcessingImpl *this)

{
  Histogram *pHVar1;
  Histogram *pHVar2;
  Histogram *pHVar3;
  ostream *poVar4;
  bool bVar5;
  allocator local_199;
  CritScope cs_capture;
  CritScope cs_render;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&cs_render,&this->crit_render_);
  rtc::CritScope::CritScope(&cs_capture,&this->crit_capture_);
  if (-1 < (this->capture_).stream_delay_jumps) {
    pHVar2 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
    if (UpdateHistogramsOnCallEnd::atomic_histogram_pointer == (Histogram *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_188,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
                 &local_199);
      pHVar2 = metrics::HistogramFactoryGetEnumeration((string *)&local_188,0x33);
      std::__cxx11::string::~string((string *)&local_188);
      pHVar3 = (Histogram *)0x0;
      LOCK();
      bVar5 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer != (Histogram *)0x0;
      pHVar1 = pHVar2;
      if (bVar5) {
        pHVar3 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
        pHVar1 = UpdateHistogramsOnCallEnd::atomic_histogram_pointer;
      }
      UpdateHistogramsOnCallEnd::atomic_histogram_pointer = pHVar1;
      UNLOCK();
      if (pHVar2 != pHVar3 && bVar5) {
        rtc::FatalMessage::FatalMessage
                  (&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x528);
        poVar4 = std::operator<<((ostream *)&local_188,
                                 "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer"
                                );
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<(poVar4,"# ");
        goto LAB_001777fe;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_188,"WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",&local_199)
    ;
    metrics::HistogramAdd(pHVar2,(string *)&local_188,(this->capture_).stream_delay_jumps);
    std::__cxx11::string::~string((string *)&local_188);
  }
  (this->capture_).stream_delay_jumps = -1;
  (this->capture_).last_stream_delay_ms = 0;
  if (-1 < (this->capture_).aec_system_delay_jumps) {
    pHVar2 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
    if (UpdateHistogramsOnCallEnd()::atomic_histogram_pointer == (Histogram *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_188,"WebRTC.Audio.NumOfAecSystemDelayJumps",&local_199);
      pHVar2 = metrics::HistogramFactoryGetEnumeration((string *)&local_188,0x33);
      std::__cxx11::string::~string((string *)&local_188);
      pHVar3 = (Histogram *)0x0;
      LOCK();
      bVar5 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer != (Histogram *)0x0;
      pHVar1 = pHVar2;
      if (bVar5) {
        pHVar3 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
        pHVar1 = UpdateHistogramsOnCallEnd()::atomic_histogram_pointer;
      }
      UpdateHistogramsOnCallEnd()::atomic_histogram_pointer = pHVar1;
      UNLOCK();
      if (pHVar2 != pHVar3 && bVar5) {
        rtc::FatalMessage::FatalMessage
                  (&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/audio_processing_impl.cc"
                   ,0x52f);
        poVar4 = std::operator<<((ostream *)&local_188,
                                 "Check failed: prev_pointer == nullptr || prev_pointer == histogram_pointer"
                                );
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::operator<<(poVar4,"# ");
LAB_001777fe:
        rtc::FatalMessage::~FatalMessage(&local_188);
      }
    }
    std::__cxx11::string::string
              ((string *)&local_188,"WebRTC.Audio.NumOfAecSystemDelayJumps",&local_199);
    metrics::HistogramAdd(pHVar2,(string *)&local_188,(this->capture_).aec_system_delay_jumps);
    std::__cxx11::string::~string((string *)&local_188);
  }
  (this->capture_).aec_system_delay_jumps = -1;
  (this->capture_).last_aec_system_delay_ms = 0;
  rtc::CritScope::~CritScope(&cs_capture);
  rtc::CritScope::~CritScope(&cs_render);
  return;
}

Assistant:

void AudioProcessingImpl::UpdateHistogramsOnCallEnd() {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

  if (capture_.stream_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION(
        "WebRTC.Audio.NumOfPlatformReportedStreamDelayJumps",
        capture_.stream_delay_jumps, 51);
  }
  capture_.stream_delay_jumps = -1;
  capture_.last_stream_delay_ms = 0;

  if (capture_.aec_system_delay_jumps > -1) {
    RTC_HISTOGRAM_ENUMERATION("WebRTC.Audio.NumOfAecSystemDelayJumps",
                              capture_.aec_system_delay_jumps, 51);
  }
  capture_.aec_system_delay_jumps = -1;
  capture_.last_aec_system_delay_ms = 0;
}